

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O2

void __thiscall sago::PlatformFolders::PlatformFolders(PlatformFolders *this)

{
  _Rb_tree_node_base *this_00;
  bool bVar1;
  int iVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  _Rb_tree_header *p_Var3;
  mapped_type *pmVar4;
  istream *piVar5;
  char *pcVar6;
  long lVar7;
  _Base_ptr p_Var8;
  char cVar9;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string key;
  ifstream infile;
  string local_50 [32];
  
  this_01 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)operator_new(0x30);
  p_Var3 = &(this_01->_M_t)._M_impl.super__Rb_tree_header;
  (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this_01->_M_t)._M_impl = 0;
  *(undefined8 *)&(this_01->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this_01->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->data = (PlatformFoldersData *)this_01;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,"XDG_DOCUMENTS_DIR",(allocator<char> *)&line);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,(key_type *)&infile);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&infile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,"XDG_DESKTOP_DIR",(allocator<char> *)&line);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,(key_type *)&infile);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&infile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,"XDG_DOWNLOAD_DIR",(allocator<char> *)&line);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,(key_type *)&infile);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&infile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,"XDG_MUSIC_DIR",(allocator<char> *)&line);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,(key_type *)&infile);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&infile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,"XDG_PICTURES_DIR",(allocator<char> *)&line);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,(key_type *)&infile);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&infile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,"XDG_PUBLICSHARE_DIR",(allocator<char> *)&line);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,(key_type *)&infile);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&infile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,"XDG_TEMPLATES_DIR",(allocator<char> *)&line);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,(key_type *)&infile);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&infile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,"XDG_VIDEOS_DIR",(allocator<char> *)&line);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,(key_type *)&infile);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&infile);
  getConfigHome_abi_cxx11_();
  std::operator+(&local_2b8,&local_298,"/user-dirs.dirs");
  std::ifstream::ifstream(&infile,local_2b8._M_dataplus._M_p,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
LAB_00105d8c:
  do {
    do {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&infile,(string *)&line);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        std::__cxx11::string::~string((string *)&line);
        std::ifstream::~ifstream
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&infile);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_298);
        for (p_Var8 = (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != p_Var3; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)
            ) {
          this_00 = p_Var8 + 2;
          iVar2 = std::__cxx11::string::compare((ulong)this_00,0,(char *)0x5);
          if (iVar2 == 0) {
            internal::getHome_abi_cxx11_();
            std::__cxx11::string::substr((ulong)&key,(ulong)this_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &infile,&line,&key);
            std::__cxx11::string::operator=((string *)this_00,(string *)&infile);
            std::__cxx11::string::~string((string *)&infile);
            std::__cxx11::string::~string((string *)&key);
            std::__cxx11::string::~string((string *)&line);
          }
        }
        return;
      }
    } while (line._M_string_length == 0);
    pcVar6 = (char *)std::__cxx11::string::at((ulong)&line);
  } while (*pcVar6 == '#');
  std::__cxx11::string::substr((ulong)&key,(ulong)&line);
  bVar1 = std::operator!=(&key,"XDG_");
  if (!bVar1) goto code_r0x00105dec;
  goto LAB_00105e9f;
code_r0x00105dec:
  lVar7 = std::__cxx11::string::find((char *)&line,0x108186);
  std::__cxx11::string::~string((string *)&key);
  if (lVar7 != -1) {
    cVar9 = (char)&line;
    std::__cxx11::string::find(cVar9,0x3d);
    std::__cxx11::string::substr((ulong)&key,(ulong)&line);
    std::__cxx11::string::find(cVar9,0x22);
    std::__cxx11::string::find(cVar9,0x22);
    std::__cxx11::string::substr((ulong)local_50,(ulong)&line);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_01,&key);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string(local_50);
LAB_00105e9f:
    std::__cxx11::string::~string((string *)&key);
  }
  goto LAB_00105d8c;
}

Assistant:

PlatformFolders::PlatformFolders() {
#if !defined(_WIN32) && !defined(__APPLE__)
	this->data = new PlatformFolders::PlatformFoldersData();
	try {
		PlatformFoldersFillData(data->folders);
	}
	catch (...) {
		delete this->data;
		throw;
	}
#endif
}